

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeTuple<float,4ul>
          (AsciiParser *this,array<float,_4UL> *result)

{
  char cVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_t i;
  long lVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  size_type *psVar9;
  char cVar10;
  ulong uVar11;
  vector<float,_std::allocator<float>_> values;
  string __str_1;
  string msg;
  string __str;
  long *local_108;
  undefined8 local_100;
  long local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  vector<float,_std::allocator<float>_> local_c8;
  ulong *local_b0;
  uint local_a8;
  undefined4 uStack_a4;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  bVar2 = Expect(this,'(');
  if (!bVar2) {
    return false;
  }
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = SepBy1BasicType<float>(this,',',&local_c8);
  if ((bVar2) && (bVar2 = Expect(this,')'), bVar2)) {
    if ((long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start == 0x10) {
      lVar5 = 0;
      do {
        result->_M_elems[lVar5] =
             local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      bVar2 = true;
      goto LAB_0039d8d9;
    }
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
    *(undefined1 *)local_50[0] = 0x34;
    plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3ca0f9);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_80 = *plVar6;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar6;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_90);
    puVar7 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar7) {
      local_d8 = *puVar7;
      lStack_d0 = plVar3[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar7;
      local_e8 = (ulong *)*plVar3;
    }
    local_e0 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar11 = (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    cVar10 = '\x01';
    if (9 < uVar11) {
      uVar8 = uVar11;
      cVar1 = '\x04';
      do {
        cVar10 = cVar1;
        if (uVar8 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_0039d6f8;
        }
        if (uVar8 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_0039d6f8;
        }
        if (uVar8 < 10000) goto LAB_0039d6f8;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar1 = cVar10 + '\x04';
      } while (bVar2);
      cVar10 = cVar10 + '\x01';
    }
LAB_0039d6f8:
    local_b0 = local_a0;
    ::std::__cxx11::string::_M_construct((ulong)&local_b0,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_b0,local_a8,uVar11);
    uVar11 = CONCAT44(uStack_a4,local_a8) + local_e0;
    uVar8 = 0xf;
    if (local_e8 != &local_d8) {
      uVar8 = local_d8;
    }
    if (uVar8 < uVar11) {
      uVar8 = 0xf;
      if (local_b0 != local_a0) {
        uVar8 = local_a0[0];
      }
      if (uVar8 < uVar11) goto LAB_0039d75e;
      puVar4 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_0039d75e:
      puVar4 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_b0);
    }
    local_108 = &local_f8;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_f8 = *plVar3;
      uStack_f0 = puVar4[3];
    }
    else {
      local_f8 = *plVar3;
      local_108 = (long *)*puVar4;
    }
    local_100 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)plVar3 = 0;
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_108);
    psVar9 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_70.field_2._M_allocated_capacity = *psVar9;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar9;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_108 != &local_f8) {
      operator_delete(local_108,local_f8 + 1);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    PushError(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = false;
LAB_0039d8d9:
  if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ParseBasicTypeTuple(std::array<T, N> *result) {
  if (!Expect('(')) {
    return false;
  }

  std::vector<T> values;
  if (!SepBy1BasicType<T>(',', &values)) {
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  if (values.size() != N) {
    std::string msg = "The number of tuple elements must be " +
                      std::to_string(N) + ", but got " +
                      std::to_string(values.size()) + "\n";
    PushError(msg);
    return false;
  }

  for (size_t i = 0; i < N; i++) {
    (*result)[i] = values[i];
  }

  return true;
}